

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void DataTypeApplyOp(ImGuiDataType data_type,int op,void *output,void *arg1,void *arg2)

{
  int iVar1;
  long lVar2;
  float fVar3;
  double dVar4;
  
  switch(data_type) {
  case 0:
  case 1:
    break;
  case 2:
  case 3:
    if (op == 0x2d) {
      lVar2 = *arg1 - *arg2;
    }
    else {
      if (op != 0x2b) {
        return;
      }
      lVar2 = *arg2 + *arg1;
    }
    *(long *)output = lVar2;
    return;
  case 4:
    if (op == 0x2d) {
      fVar3 = *arg1 - *arg2;
    }
    else {
      if (op != 0x2b) {
        return;
      }
      fVar3 = *arg1 + *arg2;
    }
    *(float *)output = fVar3;
    return;
  case 5:
    if (op == 0x2d) {
      dVar4 = *arg1 - *arg2;
    }
    else {
      if (op != 0x2b) {
        return;
      }
      dVar4 = *arg1 + *arg2;
    }
    *(double *)output = dVar4;
  default:
    return;
  }
  if (op == 0x2d) {
    iVar1 = *arg1 - *arg2;
  }
  else {
    if (op != 0x2b) {
      return;
    }
    iVar1 = *arg2 + *arg1;
  }
  *(int *)output = iVar1;
  return;
}

Assistant:

static void DataTypeApplyOp(ImGuiDataType data_type, int op, void* output, void* arg1, const void* arg2)
{
    IM_ASSERT(op == '+' || op == '-');
    switch (data_type)
    {
        case ImGuiDataType_S32:
            if (op == '+')      *(int*)output = *(const int*)arg1 + *(const int*)arg2;
            else if (op == '-') *(int*)output = *(const int*)arg1 - *(const int*)arg2;
            return;
        case ImGuiDataType_U32:
            if (op == '+')      *(unsigned int*)output = *(const unsigned int*)arg1 + *(const ImU32*)arg2;
            else if (op == '-') *(unsigned int*)output = *(const unsigned int*)arg1 - *(const ImU32*)arg2;
            return;
        case ImGuiDataType_S64:
            if (op == '+')      *(ImS64*)output = *(const ImS64*)arg1 + *(const ImS64*)arg2;
            else if (op == '-') *(ImS64*)output = *(const ImS64*)arg1 - *(const ImS64*)arg2;
            return;
        case ImGuiDataType_U64:
            if (op == '+')      *(ImU64*)output = *(const ImU64*)arg1 + *(const ImU64*)arg2;
            else if (op == '-') *(ImU64*)output = *(const ImU64*)arg1 - *(const ImU64*)arg2;
            return;
        case ImGuiDataType_Float:
            if (op == '+')      *(float*)output = *(const float*)arg1 + *(const float*)arg2;
            else if (op == '-') *(float*)output = *(const float*)arg1 - *(const float*)arg2;
            return;
        case ImGuiDataType_Double:
            if (op == '+')      *(double*)output = *(const double*)arg1 + *(const double*)arg2;
            else if (op == '-') *(double*)output = *(const double*)arg1 - *(const double*)arg2;
            return;
        case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
}